

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  byte *z;
  long in_FS_OFFSET;
  DateTime x;
  char zBuf [16];
  DateTime DStack_68;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  undefined1 local_33;
  char local_32;
  char local_31;
  undefined1 local_30;
  char local_2f;
  char local_2e;
  undefined1 local_2d;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = isDate(context,argc,argv,&DStack_68);
  if (iVar3 == 0) {
    computeYMD(&DStack_68);
    uVar1 = -DStack_68.Y;
    if (0 < DStack_68.Y) {
      uVar1 = DStack_68.Y;
    }
    uVar4 = (ulong)uVar1;
    local_37 = (char)(uVar1 / 1000) + (char)((uVar4 / 1000) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_36 = (char)(uVar1 / 100) + (char)((uVar4 / 100) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_35 = (char)(uVar1 / 10) + (char)((uVar4 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    local_34 = (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
    cVar2 = (char)(DStack_68.M / 10);
    local_32 = cVar2 + (char)((DStack_68.M / 10) / 10) * -10 + '0';
    local_31 = (char)DStack_68.M + cVar2 * -10 + '0';
    cVar2 = (char)(DStack_68.D / 10);
    local_2f = cVar2 + (char)((DStack_68.D / 10) / 10) * -10 + '0';
    local_2e = (char)DStack_68.D + cVar2 * -10 + '0';
    local_33 = 0x2d;
    local_30 = 0x2d;
    local_2d = 0;
    if (DStack_68.Y < 0) {
      z = &local_38;
      local_38 = 0x2d;
      iVar3 = 0xb;
    }
    else {
      z = &local_37;
      iVar3 = 10;
    }
    setResultStrOrError(context,(char *)z,iVar3,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}